

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O1

QRect QHighDpi::toNativeWindowGeometry<QRect,QWindow>(QRect *value,QWindow *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar10;
  uint uVar11;
  int iVar12;
  double extraout_XMM0_Qa;
  double dVar13;
  double dVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  QRect QVar20;
  
  iVar12 = 0;
  uVar8 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  if (context == (QWindow *)0x0) {
    iVar9 = 0;
    uVar10 = extraout_EDX;
  }
  else {
    cVar6 = QWindow::isTopLevel();
    iVar9 = 0;
    uVar10 = extraout_EDX_00;
    if (cVar6 != '\0') {
      iVar12 = (int)((ulong)uVar8 >> 0x20);
      iVar9 = (int)uVar8;
    }
  }
  uVar1 = value->x1;
  uVar3 = value->y1;
  uVar2 = value->x2;
  uVar4 = value->y2;
  dVar18 = (double)(uVar3 - iVar12) * extraout_XMM0_Qa;
  dVar19 = (double)(uVar1 - iVar9) * extraout_XMM0_Qa;
  dVar13 = extraout_XMM0_Qa * (double)((uVar4 - uVar3) + 1);
  dVar15 = extraout_XMM0_Qa * (double)((uVar2 - uVar1) + 1);
  auVar17._0_8_ = (double)((ulong)dVar18 & 0x8000000000000000 | 0x3fe0000000000000) + dVar18;
  auVar17._8_8_ = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
  auVar14._0_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
  auVar14._8_8_ = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
  auVar17 = minpd(_DAT_001369d0,auVar17);
  auVar14 = minpd(_DAT_001369d0,auVar14);
  auVar16._4_4_ = -(uint)(-2147483648.0 < auVar14._8_8_);
  auVar16._0_4_ = -(uint)(-2147483648.0 < auVar14._0_8_);
  auVar16._8_4_ = -(uint)(-2147483648.0 < auVar17._0_8_);
  auVar16._12_4_ = -(uint)(-2147483648.0 < auVar17._8_8_);
  uVar11 = movmskps(uVar10,auVar16);
  iVar7 = (int)auVar17._8_8_;
  if ((uVar11 & 8) == 0) {
    iVar7 = -0x80000000;
  }
  iVar5 = (int)auVar17._0_8_;
  if ((uVar11 & 4) == 0) {
    iVar5 = -0x80000000;
  }
  QVar20.x1.m_i = iVar7 + iVar9;
  iVar9 = (int)auVar14._8_8_;
  if ((uVar11 & 2) == 0) {
    iVar9 = -0x80000000;
  }
  iVar7 = (int)auVar14._0_8_;
  if ((uVar11 & 1) == 0) {
    iVar7 = -0x80000000;
  }
  QVar20.x2.m_i = iVar9 + QVar20.x1.m_i + -1;
  QVar20.y1.m_i = iVar5 + iVar12;
  QVar20.y2.m_i = iVar7 + iVar5 + iVar12 + -1;
  return QVar20;
}

Assistant:

T toNativeWindowGeometry(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    QPoint effectiveOrigin = (context && context->isTopLevel()) ? so.origin : QPoint(0,0);
    return scale(value, so.factor, effectiveOrigin);
}